

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmExtraCodeLiteGenerator::CreateProjectsByTarget_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmXMLWriter *xml)

{
  cmLocalGenerator *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  reference ppcVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_03;
  reference ppcVar4;
  string *__lhs;
  string *psVar5;
  allocator<char> local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string visualname;
  string relafilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string filename;
  string targetName;
  string *outputDir;
  TargetType type;
  cmGeneratorTarget *lt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  cmLocalGenerator *lg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs;
  cmXMLWriter *xml_local;
  cmExtraCodeLiteGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *retval;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  this_02 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_02);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_02);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&lg);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar3;
    this_03 = cmLocalGenerator::GetGeneratorTargets(this_00);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_03);
    lt = (cmGeneratorTarget *)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_03);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&lt), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      this_01 = *ppcVar4;
      TVar2 = cmGeneratorTarget::GetType(this_01);
      __lhs = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8),(string *)psVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&relafilename.field_2 + 8),__lhs,"/");
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&relafilename.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&filename.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_f0,".project");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)(relafilename.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)((long)&filename.field_2 + 8));
      cmSystemTools::RelativePath
                ((string *)((long)&visualname.field_2 + 8),&this->WorkspacePath,(string *)local_d0);
      std::__cxx11::string::string
                ((string *)local_150,(string *)(filename.field_2._M_local_buf + 8));
      if (TVar2 == EXECUTABLE) {
LAB_004f313b:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"Project",&local_191);
        cmXMLWriter::StartElement(xml,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator(&local_191);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"Name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"Path",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&visualname.field_2 + 8));
        cmXMLWriter::Attribute<char[3]>(xml,"Active",(char (*) [3])"No");
        cmXMLWriter::EndElement(xml);
        CreateNewProjectFile(this,this_01,(string *)local_d0);
      }
      else if (TVar2 - STATIC_LIBRARY < 3) {
        std::operator+(&local_170,"lib",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150);
        std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        goto LAB_004f313b;
      }
      std::__cxx11::string::~string((string *)local_150);
      std::__cxx11::string::~string((string *)(visualname.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::vector<std::string> cmExtraCodeLiteGenerator::CreateProjectsByTarget(
  cmXMLWriter* xml)
{
  std::vector<std::string> retval;
  // for each target in the workspace create a codelite project
  const std::vector<cmLocalGenerator*>& lgs =
    this->GlobalGenerator->GetLocalGenerators();
  for (cmLocalGenerator* lg : lgs) {
    for (cmGeneratorTarget* lt : lg->GetGeneratorTargets()) {
      cmStateEnums::TargetType type = lt->GetType();
      std::string const& outputDir = lg->GetCurrentBinaryDirectory();
      std::string targetName = lt->GetName();
      std::string filename = outputDir + "/" + targetName + ".project";
      retval.push_back(targetName);
      // Make the project file relative to the workspace
      std::string relafilename =
        cmSystemTools::RelativePath(this->WorkspacePath, filename);
      std::string visualname = targetName;
      switch (type) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
          visualname = "lib" + visualname;
          CM_FALLTHROUGH;
        case cmStateEnums::EXECUTABLE:
          xml->StartElement("Project");
          xml->Attribute("Name", visualname);
          xml->Attribute("Path", relafilename);
          xml->Attribute("Active", "No");
          xml->EndElement();

          CreateNewProjectFile(lt, filename);
          break;
        default:
          break;
      }
    }
  }
  return retval;
}